

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# processvid.cpp
# Opt level: O0

void unload_all_but_last_texture
               (vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>
                *tex_buf)

{
  Texture2D texture;
  Texture2D texture_00;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  pointer ppVar8;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar9;
  undefined4 uStack_5c;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_28;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_20;
  __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
  local_18;
  iterator it;
  vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_> *tex_buf_local;
  
  iVar9 = (int)tex_buf;
  uStack_5c = (undefined4)((ulong)tex_buf >> 0x20);
  it._M_current = (pair<Texture,_Texture> *)tex_buf;
  local_18._M_current =
       (pair<Texture,_Texture> *)
       std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
       begin(tex_buf);
  while( true ) {
    local_28._M_current =
         (pair<Texture,_Texture> *)
         std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>::
         end((vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_> *)
             CONCAT44(uStack_5c,iVar9));
    local_20 = __gnu_cxx::
               __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
               ::operator-(&local_28,1);
    bVar7 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar7) break;
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
             ::operator->(&local_18);
    uVar1 = (ppVar8->first).height;
    uVar2 = (ppVar8->first).mipmaps;
    uVar3 = (ppVar8->first).format;
    texture.height = uVar3;
    texture.width = uVar2;
    texture.id = uVar1;
    texture.mipmaps = in_stack_ffffffffffffff9c;
    texture.format = iVar9;
    UnloadTexture(texture);
    ppVar8 = __gnu_cxx::
             __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
             ::operator->(&local_18);
    uVar4 = (ppVar8->second).height;
    uVar5 = (ppVar8->second).mipmaps;
    uVar6 = (ppVar8->second).format;
    texture_00.height = uVar6;
    texture_00.width = uVar5;
    texture_00.id = uVar4;
    texture_00.mipmaps = in_stack_ffffffffffffff9c;
    texture_00.format = iVar9;
    UnloadTexture(texture_00);
    __gnu_cxx::
    __normal_iterator<std::pair<Texture,_Texture>_*,_std::vector<std::pair<Texture,_Texture>,_std::allocator<std::pair<Texture,_Texture>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void unload_all_but_last_texture(
	std::vector<std::pair<Texture2D, Texture2D>> tex_buf)
{
	for (auto it = tex_buf.begin(); it != tex_buf.end()-1; ++it) {
		UnloadTexture(it->first);
		UnloadTexture(it->second);
	}
}